

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fullsearch.cpp
# Opt level: O0

Position __thiscall FullSearch::getNextAction(FullSearch *this,Board *board)

{
  pointer *this_00;
  bool bVar1;
  reference pPVar2;
  int local_cc;
  int value;
  Position *choose;
  iterator __end1;
  iterator __begin1;
  vector<Position,_std::allocator<Position>_> *__range1;
  int bestValue;
  undefined1 local_90 [8];
  vector<Position,_std::allocator<Position>_> possibleChoose;
  Board tmpBoard;
  Board *board_local;
  FullSearch *this_local;
  Position bestChoose;
  
  this_00 = &possibleChoose.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  Board::Board((Board *)this_00,board);
  Board::findPossibleChoose
            ((vector<Position,_std::allocator<Position>_> *)local_90,(Board *)this_00);
  Position::Position((Position *)&this_local);
  __range1._0_4_ = -0x80000000;
  __end1 = std::vector<Position,_std::allocator<Position>_>::begin
                     ((vector<Position,_std::allocator<Position>_> *)local_90);
  choose = (Position *)
           std::vector<Position,_std::allocator<Position>_>::end
                     ((vector<Position,_std::allocator<Position>_> *)local_90);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Position_*,_std::vector<Position,_std::allocator<Position>_>_>
                                     *)&choose), bVar1) {
    pPVar2 = __gnu_cxx::
             __normal_iterator<Position_*,_std::vector<Position,_std::allocator<Position>_>_>::
             operator*(&__end1);
    Board::operator=((Board *)&possibleChoose.
                               super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,board);
    Board::doChoose((Board *)&possibleChoose.super__Vector_base<Position,_std::allocator<Position>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,*pPVar2);
    local_cc = search(this,(Board *)&possibleChoose.
                                     super__Vector_base<Position,_std::allocator<Position>_>._M_impl
                                     .super__Vector_impl_data._M_end_of_storage);
    if (tmpBoard.used._4_4_ != board->nowPlayer) {
      if (local_cc == -1) {
        local_cc = 1;
      }
      else if (local_cc == 0) {
        local_cc = 0;
      }
      else if (local_cc == 1) {
        local_cc = -1;
      }
    }
    if ((int)__range1 < local_cc) {
      __range1._0_4_ = local_cc;
      this_local = *(FullSearch **)pPVar2;
    }
    if ((int)__range1 == 1) break;
    __gnu_cxx::__normal_iterator<Position_*,_std::vector<Position,_std::allocator<Position>_>_>::
    operator++(&__end1);
  }
  std::vector<Position,_std::allocator<Position>_>::~vector
            ((vector<Position,_std::allocator<Position>_> *)local_90);
  return (Position)this_local;
}

Assistant:

Position FullSearch::getNextAction(const Board &board) {
    Board tmpBoard = board;
    vector<Position> possibleChoose = tmpBoard.findPossibleChoose();
    Position bestChoose;
    int bestValue = INT_MIN;
    for (const Position &choose : possibleChoose) {
        tmpBoard = board;
        tmpBoard.doChoose(choose);
        int value = search(tmpBoard);

        if (tmpBoard.nowPlayer != board.nowPlayer) {
            switch (value) {
                case WIN:
                    value = LOST;
                    break;
                case LOST:
                    value = WIN;
                    break;
                case TIE:
                    value = TIE;
                    break;
            }
        }
        if (value > bestValue) {
            bestValue = value;
            bestChoose = choose;
        }

        //fprintf(stderr, "value = %d\n", value);
        if (bestValue == WIN) {
            //fprintf(stderr, "%s think he will win\n", board.nowPlayer == Board::BLACK ? "black" : "white");
            break;
        }
    }

    if (bestValue == LOST) {
        //fprintf(stderr, "%s think he will lose\n", board.nowPlayer == Board::BLACK ? "black" : "white");
    }

    return bestChoose;
}